

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_init_heap_v2
                  (mz_zip_archive *pZip,size_t size_to_reserve_at_beginning,
                  size_t initial_allocation_size,mz_uint flags)

{
  mz_bool mVar1;
  void *pvVar2;
  size_t local_40;
  mz_uint flags_local;
  size_t initial_allocation_size_local;
  size_t size_to_reserve_at_beginning_local;
  mz_zip_archive *pZip_local;
  
  pZip->m_pWrite = mz_zip_heap_write_func;
  pZip->m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  if ((flags & 0x8000) != 0) {
    pZip->m_pRead = mz_zip_mem_read_func;
  }
  pZip->m_pIO_opaque = pZip;
  mVar1 = mz_zip_writer_init_v2(pZip,size_to_reserve_at_beginning,flags);
  if (mVar1 == 0) {
    pZip_local._0_4_ = 0;
  }
  else {
    pZip->m_zip_type = MZ_ZIP_TYPE_HEAP;
    local_40 = size_to_reserve_at_beginning;
    if (size_to_reserve_at_beginning < initial_allocation_size) {
      local_40 = initial_allocation_size;
    }
    if (local_40 != 0) {
      pvVar2 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_40);
      pZip->m_pState->m_pMem = pvVar2;
      if (pvVar2 == (void *)0x0) {
        mz_zip_writer_end_internal(pZip,0);
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
        }
        return 0;
      }
      pZip->m_pState->m_mem_capacity = local_40;
    }
    pZip_local._0_4_ = 1;
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_writer_init_heap_v2(mz_zip_archive *pZip,
                                   size_t size_to_reserve_at_beginning,
                                   size_t initial_allocation_size,
                                   mz_uint flags) {
  pZip->m_pWrite = mz_zip_heap_write_func;
  pZip->m_pNeeds_keepalive = NULL;

  if (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING)
    pZip->m_pRead = mz_zip_mem_read_func;

  pZip->m_pIO_opaque = pZip;

  if (!mz_zip_writer_init_v2(pZip, size_to_reserve_at_beginning, flags))
    return MZ_FALSE;

  pZip->m_zip_type = MZ_ZIP_TYPE_HEAP;

  if (0 != (initial_allocation_size = MZ_MAX(initial_allocation_size,
                                             size_to_reserve_at_beginning))) {
    if (NULL == (pZip->m_pState->m_pMem = pZip->m_pAlloc(
                     pZip->m_pAlloc_opaque, 1, initial_allocation_size))) {
      mz_zip_writer_end_internal(pZip, MZ_FALSE);
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }
    pZip->m_pState->m_mem_capacity = initial_allocation_size;
  }

  return MZ_TRUE;
}